

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O2

RK_U32 check_ref_pic_list(H264_SLICE_t *currSlice,RK_S32 cur_list)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  RK_S32 index;
  RK_S32 *pRVar4;
  h264_frame_store_t *phVar5;
  uint uVar6;
  RK_U32 RVar7;
  uint uVar8;
  uint uVar9;
  h264d_video_ctx_t *phVar10;
  RK_S32 RVar11;
  int iVar12;
  ulong uVar13;
  h264_store_pic_t *phVar14;
  MppFrame mframe;
  h264d_video_ctx_t *local_40;
  RK_S32 *local_38;
  
  phVar10 = currSlice->p_Vid;
  uVar1 = phVar10->max_frame_num;
  if (currSlice->structure == 3) {
    RVar11 = currSlice->frame_num;
  }
  else {
    uVar1 = uVar1 * 2;
    RVar11 = currSlice->frame_num * 2 + 1;
  }
  pRVar4 = currSlice->modification_of_pic_nums_idc[(uint)cur_list];
  local_38 = currSlice->abs_diff_pic_num_minus1[(uint)cur_list];
  uVar13 = 0;
  uVar9 = 0;
  iVar12 = RVar11;
  do {
    if ((0x20 < uVar13) || (iVar2 = pRVar4[uVar13], iVar2 == 3)) {
      return uVar9;
    }
    if (iVar2 < 4) {
      uVar6 = 0;
      if (iVar2 < 2) {
        if (iVar2 == 0) {
          iVar12 = iVar12 + ~local_38[uVar13];
          iVar12 = iVar12 + (iVar12 >> 0x1f & uVar1);
        }
        else {
          iVar12 = iVar12 + local_38[uVar13] + 1;
          uVar6 = uVar1;
          if (iVar12 < (int)uVar1) {
            uVar6 = 0;
          }
          iVar12 = iVar12 - uVar6;
        }
        uVar6 = 0;
        if (RVar11 < iVar12) {
          uVar6 = uVar1;
        }
        uVar8 = currSlice->p_Dpb->ref_frames_in_buffer;
LAB_00194ef5:
        uVar8 = uVar8 - 1;
        if ((int)uVar8 < 0) {
          uVar6 = 1;
          goto LAB_00194f53;
        }
        phVar5 = currSlice->p_Dpb->fs_ref[uVar8 & 0x7fffffff];
        uVar3 = phVar5->is_reference;
        if (currSlice->structure == 3) {
          if (uVar3 != 3) goto LAB_00194ef5;
          phVar14 = phVar5->frame;
        }
        else {
          if ((((uVar3 & 1) != 0) && (phVar14 = phVar5->top_field, phVar14->is_long_term == '\0'))
             && (phVar14->pic_num == iVar12 - uVar6)) goto LAB_00194f5d;
          if ((uVar3 & 2) == 0) goto LAB_00194ef5;
          phVar14 = phVar5->bottom_field;
        }
        if ((phVar14->is_long_term != '\0') || (phVar14->pic_num != iVar12 - uVar6))
        goto LAB_00194ef5;
LAB_00194f5d:
        mframe = (MppFrame)0x0;
        if ((h264d_debug._1_1_ & 0x10) == 0) {
          uVar6 = 1;
          if (phVar14 == (h264_store_pic_t *)0x0) goto LAB_00194f53;
        }
        else {
          local_40 = phVar10;
          _mpp_log_l(4,"h264d_init","find short reference, slot_idx=%d.\n",(char *)0x0,
                     (ulong)(uint)phVar14->mem_mark->slot_idx);
          phVar10 = local_40;
        }
        uVar6 = 1;
        if ((phVar14->mem_mark != (h264_dpb_mark_t *)0x0) &&
           (index = phVar14->mem_mark->slot_idx, -1 < index)) {
          mpp_buf_slot_get_prop(phVar10->p_Dec->frame_slots,index,SLOT_FRAME_PTR,&mframe);
          uVar6 = 1;
          if (mframe != (MppFrame)0x0) {
            RVar7 = mpp_frame_get_errinfo(mframe);
            uVar6 = (uint)(RVar7 != 0);
          }
        }
      }
LAB_00194f53:
      uVar9 = uVar9 | uVar6;
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

static RK_U32 check_ref_pic_list(H264_SLICE_t *currSlice, RK_S32 cur_list)
{
    RK_S32 i = 0;
    RK_U32 dpb_error_flag = 0;
    RK_S32 maxPicNum = 0, currPicNum = 0;
    RK_S32 picNumLXNoWrap = 0, picNumLXPred = 0, picNumLX = 0;

    RK_S32 *modification_of_pic_nums_idc = currSlice->modification_of_pic_nums_idc[cur_list];
    RK_S32 *abs_diff_pic_num_minus1 = currSlice->abs_diff_pic_num_minus1[cur_list];
    RK_S32 *long_term_pic_idx = currSlice->long_term_pic_idx[cur_list];
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;

    if (currSlice->structure == FRAME) {
        maxPicNum  = p_Vid->max_frame_num;
        currPicNum = currSlice->frame_num;
    } else {
        maxPicNum  = 2 * p_Vid->max_frame_num;
        currPicNum = 2 * currSlice->frame_num + 1;
    }
    picNumLXPred = currPicNum;
    for (i = 0; modification_of_pic_nums_idc[i] != 3 && i < MAX_REORDER_TIMES; i++) {
        H264_StorePic_t *tmp = NULL;
        RK_U32 error_flag = 0;
        if (modification_of_pic_nums_idc[i] > 3)
            continue;
        if (modification_of_pic_nums_idc[i] < 2) {
            if (modification_of_pic_nums_idc[i] == 0) {
                if ( (picNumLXPred - (abs_diff_pic_num_minus1[i] + 1)) < 0)
                    picNumLXNoWrap = picNumLXPred - (abs_diff_pic_num_minus1[i] + 1) + maxPicNum;
                else
                    picNumLXNoWrap = picNumLXPred - (abs_diff_pic_num_minus1[i] + 1);
            } else { //!< (modification_of_pic_nums_idc[i] == 1)
                if (picNumLXPred + (abs_diff_pic_num_minus1[i] + 1) >= maxPicNum)
                    picNumLXNoWrap = picNumLXPred + (abs_diff_pic_num_minus1[i] + 1) - maxPicNum;
                else
                    picNumLXNoWrap = picNumLXPred + (abs_diff_pic_num_minus1[i] + 1);
            }
            picNumLXPred = picNumLXNoWrap;
            picNumLX = (picNumLXNoWrap > currPicNum) ? (picNumLXNoWrap - maxPicNum) : picNumLXNoWrap;
            error_flag = 1;
            if (get_short_term_pic(currSlice, picNumLX, &tmp)) { //!< find short reference
                MppFrame mframe = NULL;
                H264D_DBG(H264D_DBG_DPB_REF_ERR, "find short reference, slot_idx=%d.\n", tmp->mem_mark->slot_idx);
                if (tmp && tmp->mem_mark && tmp->mem_mark->slot_idx >= 0) {
                    mpp_buf_slot_get_prop(p_Vid->p_Dec->frame_slots, tmp->mem_mark->slot_idx, SLOT_FRAME_PTR, &mframe);
                    if (mframe && !mpp_frame_get_errinfo(mframe)) {
                        error_flag = 0;
                    }
                }
            }

        } else { //!< (modification_of_pic_nums_idc[i] == 2)
            tmp = get_long_term_pic(currSlice, long_term_pic_idx[i]);
        }
        dpb_error_flag |= error_flag;
    }

    return dpb_error_flag;
}